

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O2

Env * leveldb::Env::Default(void)

{
  undefined8 uVar1;
  int iVar2;
  void *pvVar3;
  ulong uVar4;
  rlimit local_20;
  
  if ((Default()::env_container == '\0') &&
     (iVar2 = __cxa_guard_acquire(&Default()::env_container), iVar2 != 0)) {
    _ZN7leveldb12_GLOBAL__N_112SingletonEnvINS0_8PosixEnvEE16env_initialized_E_0 = 1;
    Default::env_container.env_storage_.__align =
         (anon_struct_8_0_00000001_for___align)&PTR__PosixEnv_00135a68;
    Default::env_container.env_storage_._8_8_ = 0;
    Default::env_container.env_storage_._16_8_ = 0;
    Default::env_container.env_storage_._24_8_ = 0;
    Default::env_container.env_storage_._32_8_ = 0;
    Default::env_container.env_storage_._40_8_ = 0;
    std::condition_variable::condition_variable
              ((condition_variable *)(Default::env_container.env_storage_.__data + 0x30));
    Default::env_container.env_storage_._96_8_ = 0x136450;
    Default::env_container.env_storage_.__data[0x68] = '\0';
    Default::env_container.env_storage_._112_8_ = 0;
    Default::env_container.env_storage_._128_8_ = 0;
    Default::env_container.env_storage_._136_8_ = 0;
    Default::env_container.env_storage_._144_8_ = 0;
    Default::env_container.env_storage_._152_8_ = 0;
    Default::env_container.env_storage_._160_8_ = 0;
    Default::env_container.env_storage_._168_8_ = 0;
    Default::env_container.env_storage_._176_8_ = 0;
    Default::env_container.env_storage_._184_8_ = 0;
    Default::env_container.env_storage_._120_8_ = 8;
    pvVar3 = operator_new(0x40);
    uVar1 = Default::env_container.env_storage_._120_8_;
    Default::env_container.env_storage_._112_8_ = pvVar3;
    Default::env_container.env_storage_._128_8_ = operator_new(0x200);
    uVar4 = uVar1 * 4 - 4U & 0xfffffffffffffff8;
    Default::env_container.env_storage_._152_8_ = (long)pvVar3 + uVar4;
    *(undefined8 *)((long)pvVar3 + uVar4) = Default::env_container.env_storage_._128_8_;
    Default::env_container.env_storage_._144_8_ =
         Default::env_container.env_storage_._128_8_ + 0x200;
    Default::env_container.env_storage_._192_8_ = 0;
    Default::env_container.env_storage_._200_8_ = 0;
    Default::env_container.env_storage_._208_8_ = 0;
    Default::env_container.env_storage_._216_8_ = 0;
    Default::env_container.env_storage_._224_8_ = 0;
    Default::env_container.env_storage_._240_4_ = 0;
    Default::env_container.env_storage_._248_8_ = 0;
    Default::env_container.env_storage_._256_8_ = 0x136538;
    Default::env_container.env_storage_._264_8_ = 0x136538;
    Default::env_container.env_storage_._272_8_ = 0;
    Default::env_container.env_storage_._280_4_ = (anonymous_namespace)::g_mmap_limit;
    Default::env_container.env_storage_._136_8_ = Default::env_container.env_storage_._128_8_;
    Default::env_container.env_storage_._160_8_ = Default::env_container.env_storage_._128_8_;
    Default::env_container.env_storage_._168_8_ = Default::env_container.env_storage_._128_8_;
    Default::env_container.env_storage_._176_8_ = Default::env_container.env_storage_._144_8_;
    Default::env_container.env_storage_._184_8_ = Default::env_container.env_storage_._152_8_;
    if ((anonymous_namespace)::g_open_read_only_file_limit < 0) {
      iVar2 = getrlimit(RLIMIT_NOFILE,&local_20);
      if (iVar2 == 0) {
        if (local_20.rlim_cur == 0xffffffffffffffff) {
          (anonymous_namespace)::g_open_read_only_file_limit = 0x7fffffff;
        }
        else {
          (anonymous_namespace)::g_open_read_only_file_limit = (int)(local_20.rlim_cur / 5);
        }
      }
      else {
        (anonymous_namespace)::g_open_read_only_file_limit = 0x32;
      }
    }
    Default::env_container.env_storage_._284_4_ = (anonymous_namespace)::g_open_read_only_file_limit
    ;
    __cxa_guard_release(&Default()::env_container);
  }
  return (Env *)&Default::env_container;
}

Assistant:

Env* Env::Default() {
  static PosixDefaultEnv env_container;
  return env_container.env();
}